

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O2

int64_t HighsIntegers::modularInverse(int64_t a,int64_t m)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (m == 1) {
    lVar2 = 0;
  }
  else {
    lVar1 = (a % m >> 0x3f & m) + a % m;
    lVar2 = 1;
    lVar4 = 0;
    while (1 < lVar1) {
      lVar5 = lVar1 % m;
      lVar3 = lVar2 - (lVar1 / m) * lVar4;
      lVar1 = m;
      lVar2 = lVar4;
      lVar4 = lVar3;
      m = lVar5;
    }
  }
  return lVar2;
}

Assistant:

static int64_t modularInverse(int64_t a, int64_t m) {
    int64_t y = 0;
    int64_t x = 1;

    if (m == 1) return 0;

    a = mod(a, m);

    while (a > 1) {
      // compute quotient q = a / m and remainder r = a % m
      int64_t q = a / m;
      int64_t r = a - q * m;

      // update (a,m) = (m,r)
      a = m;
      m = r;

      // update x and y of extended euclidean algorithm
      r = x - q * y;
      x = y;
      y = r;
    }

    return x;
  }